

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O0

void __thiscall
primesum::BinaryIndexedTree::init<std::vector<char,std::allocator<char>>>
          (BinaryIndexedTree *this,vector<char,_std::allocator<char>_> *sieve,int64_t low)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  long lVar5;
  long lVar6;
  reference pvVar7;
  ulong *puVar8;
  long in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int64_t j;
  int64_t k;
  int64_t i2;
  int64_t i;
  size_type in_stack_ffffffffffffffb8;
  ulong local_38;
  ulong local_30;
  ulong local_20;
  
  sVar3 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  in_RDI[1].super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(sVar3 >> 1);
  std::vector<__int128,_std::allocator<__int128>_>::resize(in_RDI,in_stack_ffffffffffffffb8);
  for (local_20 = 0;
      (long)local_20 <
      (long)in_RDI[1].super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
            super__Vector_impl_data._M_start; local_20 = local_20 + 1) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](in_RSI,local_20 * 2);
    lVar5 = (in_RDX + local_20 * 2) * (long)*pvVar4;
    lVar6 = lVar5 >> 0x3f;
    pvVar7 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDI,local_20);
    *(long *)((long)pvVar7 + 8) = lVar6;
    *(long *)pvVar7 = lVar5;
    local_30 = local_20 + 1 & (local_20 ^ 0xffffffffffffffff);
    local_38 = local_20;
    while (local_30 = (long)local_30 >> 1, local_30 != 0) {
      puVar8 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_RDI,local_38 - 1);
      uVar1 = *puVar8;
      uVar2 = puVar8[1];
      puVar8 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_RDI,local_20);
      puVar8[1] = puVar8[1] + uVar2 + (ulong)CARRY8(*puVar8,uVar1);
      *puVar8 = *puVar8 + uVar1;
      local_38 = local_38 - 1 & local_38;
    }
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }